

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

llama_sampler * llama_sampler_grammar_clone(llama_sampler *smpl)

{
  undefined8 *puVar1;
  llama_sampler_context_t pvVar2;
  llama_sampler *plVar3;
  llama_grammar *plVar4;
  
  puVar1 = (undefined8 *)smpl->ctx;
  plVar3 = llama_sampler_init_grammar_impl
                     ((llama_vocab *)*puVar1,(char *)0x0,(char *)0x0,false,(char **)0x0,0,
                      (llama_token *)0x0,0,(char **)0x0,0);
  if (plVar3 != (llama_sampler *)0x0) {
    if (puVar1[9] != 0) {
      pvVar2 = plVar3->ctx;
      std::__cxx11::string::_M_assign((string *)((long)pvVar2 + 8));
      std::__cxx11::string::_M_assign((string *)((long)pvVar2 + 0x28));
      plVar4 = llama_grammar_clone_impl((llama_grammar *)puVar1[9]);
      *(llama_grammar **)((long)pvVar2 + 0x48) = plVar4;
    }
    return plVar3;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-sampling.cpp"
             ,0x5c8,"GGML_ASSERT(%s) failed","result");
}

Assistant:

static struct llama_sampler * llama_sampler_grammar_clone(const struct llama_sampler * smpl) {
    const auto * ctx = (const llama_sampler_grammar *) smpl->ctx;

    auto * result = llama_sampler_init_grammar_impl(ctx->vocab, nullptr, nullptr, false, nullptr, 0, nullptr, 0, nullptr, 0);
    GGML_ASSERT(result);

    // copy the state
    {
        auto * result_ctx = (llama_sampler_grammar *) result->ctx;

        if (ctx->grammar) {
            result_ctx->grammar_str  = ctx->grammar_str;
            result_ctx->grammar_root = ctx->grammar_root;

            result_ctx->grammar = llama_grammar_clone_impl(*ctx->grammar);
        }
    }

    return result;
}